

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool generateLowResWaveform<short>
               (TWaveformViewT<short> *waveform,TWaveformT<short> *waveformLowRes,int nWindow)

{
  short sVar1;
  short *psVar2;
  size_type __n;
  long *plVar3;
  size_type sVar4;
  long *plVar5;
  long *plVar6;
  short sVar7;
  size_type __n_00;
  TWaveformT<short> waveformAbs;
  long local_a0;
  _Deque_base<long,_std::allocator<long>_> local_98;
  vector<short,_std::allocator<short>_> local_48;
  
  std::vector<short,_std::allocator<short>_>::resize(waveformLowRes,waveform->n);
  __n_00 = (size_type)nWindow;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)&local_98,__n_00,(allocator_type *)&local_48);
  psVar2 = waveform->samples;
  __n = waveform->n;
  std::vector<short,_std::allocator<short>_>::vector(&local_48,__n,(allocator_type *)&local_a0);
  if (0 < (long)__n) {
    sVar4 = 0;
    do {
      sVar1 = psVar2[sVar4];
      sVar7 = -sVar1;
      if (0 < sVar1) {
        sVar7 = sVar1;
      }
      local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar4] = sVar7;
      sVar4 = sVar4 + 1;
    } while (__n != sVar4);
    local_a0 = 0;
    if (0 < (long)__n) {
      do {
        plVar3 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_a0 < (long)__n_00) {
          plVar5 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          plVar3 = local_98._M_impl.super__Deque_impl_data._M_finish._M_first;
          if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur == plVar3) {
                if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a0] <
                    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]]) break;
                operator_delete(plVar3,0x200);
                plVar3 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_98._M_impl.super__Deque_impl_data._M_finish._M_last = plVar3 + 0x40;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar3 + 0x3f;
                plVar5 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_first = plVar3;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a0] <
                    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_98._M_impl.super__Deque_impl_data._M_finish._M_cur[-1]]) break;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            } while (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur != plVar5);
          }
          if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                      ((deque<long,std::allocator<long>> *)&local_98,&local_a0);
          }
          else {
            *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = local_a0;
            local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        else {
          while ((plVar3 != local_98._M_impl.super__Deque_impl_data._M_start._M_cur &&
                 (*local_98._M_impl.super__Deque_impl_data._M_start._M_cur <=
                  (long)(local_a0 - __n_00)))) {
            if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_98._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              plVar3 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
              local_98._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_98._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
          }
          plVar6 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          plVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_first;
          if (plVar3 != local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              if (plVar3 == plVar5) {
                if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a0] <
                    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]]) break;
                operator_delete(plVar5,0x200);
                plVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_98._M_impl.super__Deque_impl_data._M_finish._M_last = plVar5 + 0x40;
                plVar3 = plVar5 + 0x3f;
                plVar6 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_first = plVar5;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a0] <
                    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[plVar3[-1]]) break;
                plVar3 = plVar3 + -1;
              }
              local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar3;
            } while (plVar3 != plVar6);
          }
          if (plVar3 == local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                      ((deque<long,std::allocator<long>> *)&local_98,&local_a0);
            plVar6 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          }
          else {
            *plVar3 = local_a0;
            local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar3 + 1;
          }
          (waveformLowRes->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_start[local_a0 - nWindow / 2] =
               local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start[*plVar6];
        }
        local_a0 = local_a0 + 1;
      } while (local_a0 < (long)__n);
    }
  }
  if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_98);
  return true;
}

Assistant:

bool generateLowResWaveform(const TWaveformViewT<T> & waveform, TWaveformT<T> & waveformLowRes, int nWindow) {
    waveformLowRes.resize(waveform.n);

    int k = nWindow;
    std::deque<int64_t> que(k);

    //auto [samples, n] = waveform;
    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            waveformLowRes[itest] = waveformAbs[que.front()];
        }
    }

    return true;
}